

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  void **this_00;
  linked_ptr_internal *plVar1;
  FailureReporterInterface *pFVar2;
  linked_ptr_internal in_RDX;
  linked_ptr_internal *extraout_RDX;
  linked_ptr_internal *extraout_RDX_00;
  linked_ptr_internal *extraout_RDX_01;
  long *plVar3;
  bool bVar4;
  Expectation EVar5;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  plVar3 = *(long **)((long)&(exp->source_text_).field_2 + 8);
  bVar4 = plVar3 == *(long **)&exp->cardinality_specified_;
  if (!bVar4) {
    plVar1 = (linked_ptr_internal *)*plVar3;
    while (plVar1 != in_RDX.next_) {
      plVar3 = plVar3 + 2;
      bVar4 = plVar3 == *(long **)&exp->cardinality_specified_;
      if (bVar4) goto LAB_0013c8eb;
      plVar1 = (linked_ptr_internal *)*plVar3;
    }
    this->_vptr_UntypedFunctionMockerBase = (_func_int **)plVar1;
    this_00 = &this->mock_obj_;
    if (plVar1 == (linked_ptr_internal *)0x0) {
      *this_00 = this_00;
    }
    else {
      linked_ptr_internal::join((linked_ptr_internal *)this_00,(linked_ptr_internal *)(plVar3 + 1));
      in_RDX.next_ = extraout_RDX;
    }
    if (!bVar4) goto LAB_0013c94a;
  }
LAB_0013c8eb:
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Cannot find expectation.","");
  pFVar2 = GetFailureReporter();
  (*pFVar2->_vptr_FailureReporterInterface[2])
            (pFVar2,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gmock-gtest-all.cc"
             ,0x2a92,local_38);
  in_RDX.next_ = extraout_RDX_00;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
    in_RDX.next_ = extraout_RDX_01;
  }
  this->_vptr_UntypedFunctionMockerBase = (_func_int **)0x0;
  this->mock_obj_ = &this->mock_obj_;
LAB_0013c94a:
  EVar5.expectation_base_.link_.next_ = in_RDX.next_;
  EVar5.expectation_base_.value_ = (ExpectationBase *)this;
  return (Expectation)EVar5.expectation_base_;
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}